

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

void glfwSetCursorPos(GLFWwindow *handle,double xpos,double ypos)

{
  _GLFWwindow *window;
  double ypos_local;
  double xpos_local;
  GLFWwindow *handle_local;
  
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if ((_glfw.focusedWindow == (_GLFWwindow *)handle) &&
          ((((xpos != *(double *)(handle + 0x40) || (NAN(xpos) || NAN(*(double *)(handle + 0x40))))
            || (ypos != *(double *)(handle + 0x48))) ||
           (NAN(ypos) || NAN(*(double *)(handle + 0x48)))))) {
    *(double *)(handle + 0x40) = xpos;
    *(double *)(handle + 0x48) = ypos;
    if (*(int *)(handle + 0x50) != 0x34003) {
      _glfwPlatformSetCursorPos((_GLFWwindow *)handle,xpos,ypos);
    }
  }
  return;
}

Assistant:

GLFWAPI void glfwSetCursorPos(GLFWwindow* handle, double xpos, double ypos)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT();

    if (_glfw.focusedWindow != window)
        return;

    // Don't do anything if the cursor position did not change
    if (xpos == window->cursorPosX && ypos == window->cursorPosY)
        return;

    // Set GLFW cursor position
    window->cursorPosX = xpos;
    window->cursorPosY = ypos;

    // Do not move physical cursor if it is disabled
    if (window->cursorMode == GLFW_CURSOR_DISABLED)
        return;

    // Update physical cursor position
    _glfwPlatformSetCursorPos(window, xpos, ypos);
}